

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_prefix(FuncState *fs,UnOpr op,expdesc *e,int line)

{
  int iVar1;
  int iVar2;
  
  if (op < OPR_NOT) {
    iVar2 = constfolding(fs,op + 0xc,e,&luaK_prefix::ef);
    if (iVar2 != 0) {
      return;
    }
  }
  else {
    if (op == OPR_NOT) {
      luaK_dischargevars(fs,e);
      switch(e->k) {
      case VNIL:
      case VFALSE:
        e->k = VTRUE;
        break;
      case VTRUE:
      case VK:
      case VKFLT:
      case VKINT:
        e->k = VFALSE;
        break;
      case VNONRELOC:
      case VRELOCABLE:
        discharge2anyreg(fs,e);
        freeexp(fs,e);
        iVar2 = luaK_code(fs,(e->u).info << 0x17 | 0x1b);
        (e->u).info = iVar2;
        e->k = VRELOCABLE;
        break;
      case VJMP:
        negatecondition(fs,e);
      }
      iVar2 = e->t;
      iVar1 = e->f;
      e->f = iVar2;
      e->t = iVar1;
      removevalues(fs,iVar2);
      removevalues(fs,e->t);
      return;
    }
    if (op != OPR_LEN) {
      return;
    }
  }
  iVar2 = luaK_exp2anyreg(fs,e);
  freeexp(fs,e);
  iVar2 = luaK_code(fs,iVar2 << 0x17 | op + 0x19);
  (e->u).info = iVar2;
  e->k = VRELOCABLE;
  fs->f->lineinfo[(long)fs->pc + -1] = line;
  return;
}

Assistant:

void luaK_prefix (FuncState *fs, UnOpr op, expdesc *e, int line) {
  static expdesc ef = {VKINT, {0}, NO_JUMP, NO_JUMP};  /* fake 2nd operand */
  switch (op) {
    case OPR_MINUS: case OPR_BNOT:
      if (constfolding(fs, op + LUA_OPUNM, e, &ef))
        break;
      /* FALLTHROUGH */
    case OPR_LEN:
      codeunexpval(fs, cast(OpCode, op + OP_UNM), e, line);
      break;
    case OPR_NOT: codenot(fs, e); break;
    default: lua_assert(0);
  }
}